

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strparse.c
# Opt level: O1

int str_num_base(char **linep,curl_off_t *nump,curl_off_t max,int base)

{
  int iVar1;
  long lVar2;
  long lVar3;
  char cVar4;
  char *pcVar5;
  char *pcVar6;
  char cVar7;
  ulong uVar8;
  
  cVar4 = '7';
  if (base == 0x10) {
    cVar4 = 'f';
  }
  cVar7 = '9';
  if (base != 10) {
    cVar7 = cVar4;
  }
  *nump = 0;
  cVar4 = **linep;
  iVar1 = 8;
  if ((cVar4 <= cVar7 && '/' < cVar4) &&
     ((0x1ffffff81fc00U >> ((ulong)(byte)(cVar4 - 0x30) & 0x3f) & 1) == 0)) {
    uVar8 = (ulong)(uint)base;
    pcVar5 = *linep + 1;
    lVar2 = 0;
    if (max < (long)uVar8) {
      do {
        pcVar6 = pcVar5;
        lVar3 = lVar2 * uVar8 + (ulong)((byte)(&DAT_001858a0)[pcVar6[-1]] & 0xf);
        if (max < lVar3) {
          return 7;
        }
        cVar4 = *pcVar6;
      } while ((('/' < cVar4) && (cVar4 <= cVar7)) &&
              (lVar2 = lVar3, pcVar5 = pcVar6 + 1,
              (0x1ffffff81fc00U >> ((ulong)(byte)(cVar4 - 0x30) & 0x3f) & 1) == 0));
    }
    else {
      do {
        pcVar6 = pcVar5;
        lVar3 = lVar2 * uVar8 + (ulong)((byte)(&DAT_001858a0)[pcVar6[-1]] & 0xf);
        if ((long)(max - (ulong)((byte)(&DAT_001858a0)[pcVar6[-1]] & 0xf)) / (long)uVar8 < lVar2) {
          return 7;
        }
        cVar4 = *pcVar6;
      } while ((('/' < cVar4) && (cVar4 <= cVar7)) &&
              (lVar2 = lVar3, pcVar5 = pcVar6 + 1,
              (0x1ffffff81fc00U >> ((ulong)(byte)(cVar4 - 0x30) & 0x3f) & 1) == 0));
    }
    *nump = lVar3;
    *linep = pcVar6;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int str_num_base(const char **linep, curl_off_t *nump, curl_off_t max,
                        int base) /* 8, 10 or 16, nothing else */
{
  curl_off_t num = 0;
  const char *p;
  int m = (base == 10) ? '9' :   /* the largest digit possible */
    (base == 16) ? 'f' : '7';
  DEBUGASSERT(linep && *linep && nump);
  DEBUGASSERT((base == 8) || (base == 10) || (base == 16));
  DEBUGASSERT(max >= 0); /* mostly to catch SIZE_T_MAX, which is too large */
  *nump = 0;
  p = *linep;
  if(!valid_digit(*p, m))
    return STRE_NO_NUM;
  if(max < base) {
    /* special-case low max scenario because check needs to be different */
    do {
      int n = Curl_hexval(*p++);
      num = num * base + n;
      if(num > max)
        return STRE_OVERFLOW;
    } while(valid_digit(*p, m));
  }
  else {
    do {
      int n = Curl_hexval(*p++);
      if(num > ((max - n) / base))
        return STRE_OVERFLOW;
      num = num * base + n;
    } while(valid_digit(*p, m));
  }
  *nump = num;
  *linep = p;
  return STRE_OK;
}